

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O1

void __thiscall
MakefileGenerator::callExtraCompilerDependCommand
          (MakefileGenerator *this,ProString *extraCompiler,QString *tmp_dep_cmd,QString *inpf,
          QString *tmp_out,bool dep_lines,QStringList *deps,bool existingDepsOnly,
          bool checkCommandAvailability)

{
  SourceFiles **s;
  QString string;
  QString string_00;
  QString file;
  QString file_00;
  int *piVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  QMakeProject *pQVar5;
  Data *pDVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  FILE *__stream;
  size_t sVar11;
  pointer pQVar12;
  long lVar13;
  char *pcVar14;
  QString *__return_storage_ptr__;
  longlong lVar15;
  QMakeLocalFileName *pQVar16;
  QString *file_01;
  Data *pDVar17;
  long in_FS_OFFSET;
  QByteArrayView QVar18;
  QStringView QVar19;
  QStringView QVar20;
  QDir outDir;
  QStringList deps_1;
  char buff [256];
  Data *pDVar21;
  QString *file_02;
  undefined8 in_stack_fffffffffffffd90;
  char16_t *pcVar22;
  qsizetype in_stack_fffffffffffffd98;
  undefined1 local_248 [32];
  QString local_228;
  QArrayDataPointer<QString> local_208;
  QString local_1e8;
  QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String>,_QString>
  local_1c8;
  Data *local_178;
  QMakeProject *pQStack_170;
  Data *local_168;
  QArrayDataPointer<QString> local_158;
  MakefileGenerator local_140;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_140.super_QMakeSourceFileInfo.files,0xaa,0x100);
  local_168 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_178 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  pQStack_170 = (QMakeProject *)&DAT_aaaaaaaaaaaaaaaa;
  local_1c8.a.a.a.m_size = 0;
  local_1c8.a.a.a.m_data = (char *)0x0;
  local_1c8.a.a.b.d.d = (Data *)0x0;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
            ((QMovableArrayOps<QString> *)&local_1c8,0,inpf);
  QList<QString>::end((QList<QString> *)&local_1c8);
  local_158.d = (Data *)0x0;
  local_158.ptr = (QString *)0x0;
  local_158.size = 0;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
            ((QMovableArrayOps<QString> *)&local_158,0,tmp_out);
  QList<QString>::end((QList<QString> *)&local_158);
  (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xb])
            (&local_178,this,tmp_dep_cmd,&local_1c8,&local_158,1);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_158);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_1c8);
  if (checkCommandAvailability) {
    QString::split(&local_1c8,&local_178,0x20,0,1);
    bVar7 = canExecute(this,(QStringList *)&local_1c8,(int *)0x0);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_1c8);
    if (!bVar7) goto LAB_00172014;
  }
  local_1c8.a.a.a.m_size = (qsizetype)Option::output_dir.d.d;
  local_1c8.a.a.a.m_data = (char *)Option::output_dir.d.ptr;
  local_1c8.a.a.b.d.d = (Data *)Option::output_dir.d.size;
  if (Option::output_dir.d.d != (Data *)0x0) {
    LOCK();
    ((Option::output_dir.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((Option::output_dir.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         1;
    UNLOCK();
  }
  string.d.ptr = (char16_t *)in_stack_fffffffffffffd90;
  string.d.d = (Data *)tmp_dep_cmd;
  string.d.size = in_stack_fffffffffffffd98;
  Option::fixString((QString *)&local_208,string,(uchar)&local_1c8);
  if ((Data *)local_1c8.a.a.a.m_size != (Data *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_1c8.a.a.a.m_size)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_1c8.a.a.a.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_1c8.a.a.a.m_size)->_q_value).super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate((QArrayData *)local_1c8.a.a.a.m_size,2,0x10);
    }
  }
  QMakeInternal::IoUtils::shellQuoteUnix(&local_1e8,(QString *)&local_208);
  qVar4 = local_1e8.d.size;
  pcVar22 = local_1e8.d.ptr;
  pDVar21 = (Data *)local_1e8.d.d;
  local_1e8.d.d = (Data *)0x0;
  local_1e8.d.ptr = (char16_t *)0x0;
  local_1e8.d.size = 0;
  local_1c8.a.a.a.m_size = (qsizetype)local_178;
  local_1c8.a.a.a.m_data = (char *)pQStack_170;
  local_1c8.a.a.b.d.d = local_168;
  if (local_178 != (Data *)0x0) {
    LOCK();
    (local_178->ref).atomic._q_value.super___atomic_base<int>._M_i =
         (local_178->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  string_00.d.ptr = pcVar22;
  string_00.d.d = (Data *)pDVar21;
  string_00.d.size = in_stack_fffffffffffffd98;
  Option::fixString(&local_228,string_00,(uchar)&local_1c8);
  if ((Data *)local_1c8.a.a.a.m_size != (Data *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_1c8.a.a.a.m_size)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_1c8.a.a.a.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_1c8.a.a.a.m_size)->_q_value).super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate((QArrayData *)local_1c8.a.a.a.m_size,2,0x10);
    }
  }
  local_1c8.b.d.size = local_228.d.size;
  local_1c8.b.d.ptr = local_228.d.ptr;
  local_1c8.b.d.d = local_228.d.d;
  local_1c8.a.a.a.m_size = 3;
  local_1c8.a.a.a.m_data = "cd ";
  local_1c8.a.a.b.d.size = qVar4;
  local_1c8.a.b.m_size = 4;
  local_1c8.a.b.m_data = " && ";
  local_228.d.d = (Data *)0x0;
  local_228.d.ptr = (char16_t *)0x0;
  local_228.d.size = 0;
  local_1c8.a.a.b.d.d = (Data *)pDVar21;
  QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String>,_QString>::
  convertTo<QString>((QString *)&local_158,&local_1c8);
  qVar4 = local_158.size;
  pDVar6 = local_158.d;
  pQVar5 = pQStack_170;
  pDVar17 = local_178;
  local_158.d = (Data *)local_178;
  local_178 = (Data *)pDVar6;
  pQStack_170 = (QMakeProject *)local_158.ptr;
  local_158.ptr = (QString *)pQVar5;
  local_158.size = (qsizetype)local_168;
  local_168 = (Data *)qVar4;
  if (pDVar17 != (Data *)0x0) {
    LOCK();
    (pDVar17->ref).atomic._q_value.super___atomic_base<int>._M_i =
         (pDVar17->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar17->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)pDVar17,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String>,_QString>::
  ~QStringBuilder(&local_1c8);
  if ((Data *)local_228.d.d != (Data *)0x0) {
    LOCK();
    ((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_228.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((Data *)local_1e8.d.d != (Data *)0x0) {
    LOCK();
    ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,2,0x10);
    }
  }
  piVar1 = (int *)CONCAT44(local_208.d._4_4_,local_208.d._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_208.d._4_4_,local_208.d._0_4_),2,0x10);
    }
  }
  QString::toLatin1_helper((QString *)&local_1c8);
  pQVar16 = (QMakeLocalFileName *)local_1c8.a.a.a.m_data;
  if ((QMakeLocalFileName *)local_1c8.a.a.a.m_data == (QMakeLocalFileName *)0x0) {
    pQVar16 = (QMakeLocalFileName *)&QByteArray::_empty;
  }
  __stream = popen((char *)pQVar16,"r");
  if ((Data *)local_1c8.a.a.a.m_size != (Data *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_1c8.a.a.a.m_size)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_1c8.a.a.a.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_1c8.a.a.a.m_size)->_q_value).super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate((QArrayData *)local_1c8.a.a.a.m_size,1,0x10);
    }
  }
  if (__stream != (FILE *)0x0) {
    local_158.d = (Data *)0x0;
    local_158.ptr = (QString *)0x0;
    local_158.size = 0;
    s = &local_140.super_QMakeSourceFileInfo.files;
    while( true ) {
      iVar9 = feof(__stream);
      iVar10 = 0;
      if (iVar9 == 0) {
        sVar11 = fread(s,1,0xff,__stream);
        iVar10 = (int)sVar11;
      }
      if (iVar10 == 0) break;
      QByteArray::append((QByteArray *)&local_158,(char *)s,(long)iVar10);
    }
    pclose(__stream);
    local_1e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_1e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_1e8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QVar18.m_data = (storage_type *)local_158.size;
    QVar18.m_size = (qsizetype)&local_1e8;
    QString::fromLocal8Bit(QVar18);
    if ((Data *)local_1e8.d.size != (Data *)0x0) {
      local_248._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QDir::QDir((QDir *)(local_248 + 0x18),(QString *)&Option::output_dir);
      local_208.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_208.d._0_4_ = 0xaaaaaaaa;
      local_208.d._4_4_ = 0xaaaaaaaa;
      local_208.ptr._0_4_ = 0xaaaaaaaa;
      local_208.ptr._4_4_ = 0xaaaaaaaa;
      if (dep_lines) {
        local_208.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_208.d._0_4_ = 0xaaaaaaaa;
        local_208.d._4_4_ = 0xaaaaaaaa;
        local_208.ptr._0_4_ = 0xaaaaaaaa;
        local_208.ptr._4_4_ = 0xaaaaaaaa;
        QString::split(&local_208,&local_1e8,10,1,1);
      }
      else {
        QString::simplified_helper((QString *)&local_1c8);
        QString::split(&local_208,&local_1c8,0x20,0,1);
        if ((Data *)local_1c8.a.a.a.m_size != (Data *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_1c8.a.a.a.m_size)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_1c8.a.a.a.m_size)->_q_value).super___atomic_base<int>._M_i
               + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_1c8.a.a.a.m_size)->_q_value).super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate((QArrayData *)local_1c8.a.a.a.m_size,2,0x10);
          }
        }
      }
      if ((char *)local_208.size != (char *)0x0) {
        lVar13 = 0;
        pcVar14 = (char *)0x0;
        do {
          pQVar12 = QList<QString>::data((QList<QString> *)&local_208);
          file_02 = (QString *)((long)&(pQVar12->d).d + lVar13);
          local_228.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_228.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_228.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QDir::absoluteFilePath((QString *)&local_228);
          qVar4 = local_228.d.size;
          pcVar3 = local_228.d.ptr;
          pDVar21 = *(Data **)((long)&(pQVar12->d).size + lVar13);
          file_01 = file_02;
          if (((Data *)local_228.d.size != pDVar21) ||
             (QVar19.m_data = local_228.d.ptr, QVar19.m_size = local_228.d.size,
             QVar20.m_data = *(storage_type_conflict **)((long)&(pQVar12->d).ptr + lVar13),
             QVar20.m_size = (qsizetype)pDVar21, cVar8 = QtPrivate::equalStrings(QVar19,QVar20),
             file_01 = file_02, cVar8 == '\0')) {
            pDVar2 = local_228.d.d;
            if ((Data *)local_228.d.d != (Data *)0x0) {
              LOCK();
              ((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   1;
              UNLOCK();
              LOCK();
              ((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   1;
              UNLOCK();
            }
            local_1c8.a.a.b.d.d = (Data *)qVar4;
            local_1c8.a.a.a.m_data = (char *)pcVar3;
            local_1c8.a.a.a.m_size = (qsizetype)local_228.d.d;
            file.d.ptr = pcVar22;
            file.d.d = (Data *)file_01;
            file.d.size = in_stack_fffffffffffffd98;
            fileInfo((MakefileGenerator *)local_248,file);
            cVar8 = QFileInfo::exists();
            QFileInfo::~QFileInfo((QFileInfo *)local_248);
            if ((Data *)local_1c8.a.a.a.m_size != (Data *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_1c8.a.a.a.m_size)->_q_value).super___atomic_base<int>._M_i
                   = (((QBasicAtomicInt *)local_1c8.a.a.a.m_size)->_q_value).
                     super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_1c8.a.a.a.m_size)->_q_value).super___atomic_base<int>.
                  _M_i == 0) {
                QArrayData::deallocate((QArrayData *)local_1c8.a.a.a.m_size,2,0x10);
              }
            }
            file_02 = file_01;
            if ((Data *)pDVar2 != (Data *)0x0) {
              LOCK();
              (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
              }
            }
            if (cVar8 == '\0') {
              local_248._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_248._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_248._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              __return_storage_ptr__ = (QString *)local_248;
              resolveDependency(__return_storage_ptr__,this,(QDir *)(local_248 + 0x18),file_01);
              if ((SourceFiles *)local_248._16_8_ == (SourceFiles *)0x0) {
                pDVar17 = *(Data **)((long)&(pQVar12->d).d + lVar13);
                local_1c8.a.a.a.m_data = *(char **)((long)&(pQVar12->d).ptr + lVar13);
                local_1c8.a.a.b.d.d = *(Data **)((long)&(pQVar12->d).size + lVar13);
                if (pDVar17 != (Data *)0x0) {
                  LOCK();
                  (pDVar17->ref).atomic._q_value.super___atomic_base<int>._M_i =
                       (pDVar17->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
                  UNLOCK();
                  LOCK();
                  (pDVar17->ref).atomic._q_value.super___atomic_base<int>._M_i =
                       (pDVar17->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
                  UNLOCK();
                }
                file_00.d.ptr = pcVar22;
                file_00.d.d = (Data *)file_02;
                file_00.d.size = in_stack_fffffffffffffd98;
                local_1c8.a.a.a.m_size = (qsizetype)pDVar17;
                fileInfo(&local_140,file_00);
                cVar8 = QFileInfo::exists();
                QFileInfo::~QFileInfo((QFileInfo *)&local_140);
                file_01 = file_02;
                if ((Data *)local_1c8.a.a.a.m_size != (Data *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_1c8.a.a.a.m_size)->_q_value).super___atomic_base<int>.
                  _M_i = (((QBasicAtomicInt *)local_1c8.a.a.a.m_size)->_q_value).
                         super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_1c8.a.a.a.m_size)->_q_value).
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate((QArrayData *)local_1c8.a.a.a.m_size,2,0x10);
                    file_01 = file_02;
                  }
                }
                file_02 = file_01;
                if (pDVar17 != (Data *)0x0) {
                  LOCK();
                  (pDVar17->ref).atomic._q_value.super___atomic_base<int>._M_i =
                       (pDVar17->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((pDVar17->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate((QArrayData *)pDVar17,2,0x10);
                  }
                }
                if (cVar8 == '\0') {
                  if (!existingDepsOnly) {
                    __return_storage_ptr__ = &local_228;
                    goto LAB_00171cf0;
                  }
                  if (*(long *)((long)&(pQVar12->d).ptr + lVar13) != 0) {
                    pDVar17 = (Data *)(file_01->d).d;
                    (file_01->d).d = (Data *)0x0;
                    (file_01->d).ptr = (char16_t *)0x0;
                    (file_01->d).size = 0;
                    if (pDVar17 != (Data *)0x0) {
                      LOCK();
                      (((QArrayData *)&pDVar17->ref)->ref_)._q_value.super___atomic_base<int>._M_i =
                           (((QArrayData *)&pDVar17->ref)->ref_)._q_value.super___atomic_base<int>.
                           _M_i + -1;
                      UNLOCK();
                      if ((((QArrayData *)&pDVar17->ref)->ref_)._q_value.super___atomic_base<int>.
                          _M_i == 0) {
                        lVar15 = 2;
                        goto LAB_00171f76;
                      }
                    }
                  }
                }
                else {
                  ProString::toLatin1((QByteArray *)&local_1c8,extraCompiler);
                  pQVar16 = (QMakeLocalFileName *)local_1c8.a.a.a.m_data;
                  if ((QMakeLocalFileName *)local_1c8.a.a.a.m_data == (QMakeLocalFileName *)0x0) {
                    pQVar16 = (QMakeLocalFileName *)&QByteArray::_empty;
                  }
                  warn_msg(WarnDeprecated,
                           ".depend_command for extra compiler %s prints paths relative to source directory"
                           ,pQVar16);
                  if ((Data *)local_1c8.a.a.a.m_size != (Data *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_1c8.a.a.a.m_size)->_q_value).super___atomic_base<int>
                    ._M_i = (((QBasicAtomicInt *)local_1c8.a.a.a.m_size)->_q_value).
                            super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_1c8.a.a.a.m_size)->_q_value).
                        super___atomic_base<int>._M_i == 0) {
                      lVar15 = 1;
                      pDVar17 = (Data *)local_1c8.a.a.a.m_size;
LAB_00171f76:
                      QArrayData::deallocate((QArrayData *)pDVar17,lVar15,0x10);
                    }
                  }
                }
              }
              else {
LAB_00171cf0:
                QString::operator=(file_01,(QString *)__return_storage_ptr__);
              }
              if ((QArrayData *)local_248._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_248._0_8_,2,0x10);
                }
              }
            }
            else {
              QString::operator=(file_01,(QString *)&local_228);
            }
          }
          if (*(long *)((long)&(pQVar12->d).size + lVar13) != 0) {
            fileFixify((QString *)&local_1c8,this,file_02,(FileFixifyTypes)0x0,true);
            pDVar17 = *(Data **)((long)&(pQVar12->d).d + lVar13);
            *(qsizetype *)((long)&(pQVar12->d).d + lVar13) = local_1c8.a.a.a.m_size;
            pQVar16 = *(QMakeLocalFileName **)((long)&(pQVar12->d).ptr + lVar13);
            *(char **)((long)&(pQVar12->d).ptr + lVar13) = local_1c8.a.a.a.m_data;
            pDVar21 = *(Data **)((long)&(pQVar12->d).size + lVar13);
            *(Data **)((long)&(pQVar12->d).size + lVar13) = local_1c8.a.a.b.d.d;
            local_1c8.a.a.a.m_size = (qsizetype)pDVar17;
            local_1c8.a.a.a.m_data = (char *)pQVar16;
            local_1c8.a.a.b.d.d = (Data *)pDVar21;
            if (pDVar17 != (Data *)0x0) {
              LOCK();
              (pDVar17->ref).atomic._q_value.super___atomic_base<int>._M_i =
                   (pDVar17->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pDVar17->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate((QArrayData *)pDVar17,2,0x10);
              }
            }
          }
          if ((Data *)local_228.d.d != (Data *)0x0) {
            LOCK();
            ((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_228.d.d)->super_QArrayData,2,0x10);
            }
          }
          pcVar14 = pcVar14 + 1;
          lVar13 = lVar13 + 0x18;
        } while (pcVar14 < (ulong)local_208.size);
      }
      QtPrivate::QCommonArrayOps<QString>::growAppend
                ((QCommonArrayOps<QString> *)deps,
                 (QString *)CONCAT44(local_208.ptr._4_4_,local_208.ptr._0_4_),
                 (QString *)CONCAT44(local_208.ptr._4_4_,local_208.ptr._0_4_) + local_208.size);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_208);
      QDir::~QDir((QDir *)(local_248 + 0x18));
    }
    if ((Data *)local_1e8.d.d != (Data *)0x0) {
      LOCK();
      ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((Data *)local_158.d != (Data *)0x0) {
      LOCK();
      ((local_158.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_158.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_158.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_158.d)->super_QArrayData,1,0x10);
      }
    }
  }
LAB_00172014:
  if (local_178 != (Data *)0x0) {
    LOCK();
    (local_178->ref).atomic._q_value.super___atomic_base<int>._M_i =
         (local_178->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_178->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_178,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void MakefileGenerator::callExtraCompilerDependCommand(const ProString &extraCompiler,
                                                       const QString &tmp_dep_cmd,
                                                       const QString &inpf,
                                                       const QString &tmp_out,
                                                       bool dep_lines,
                                                       QStringList *deps,
                                                       bool existingDepsOnly,
                                                       bool checkCommandAvailability)
{
    char buff[256];
    QString dep_cmd = replaceExtraCompilerVariables(tmp_dep_cmd, inpf, tmp_out, LocalShell);
    if (checkCommandAvailability && !canExecute(dep_cmd))
        return;
    dep_cmd = QLatin1String("cd ")
            + IoUtils::shellQuote(Option::fixPathToLocalOS(Option::output_dir, false))
            + QLatin1String(" && ")
            + fixEnvVariables(dep_cmd);
    if (FILE *proc = QT_POPEN(dep_cmd.toLatin1().constData(), QT_POPEN_READ)) {
        QByteArray depData;
        while (int read_in = feof(proc) ? 0 : (int)fread(buff, 1, 255, proc))
            depData.append(buff, read_in);
        QT_PCLOSE(proc);
        const QString indeps = QString::fromLocal8Bit(depData);
        if (indeps.isEmpty())
            return;
        QDir outDir(Option::output_dir);
        QStringList dep_cmd_deps = splitDeps(indeps, dep_lines);
        for (int i = 0; i < dep_cmd_deps.size(); ++i) {
            QString &file = dep_cmd_deps[i];
            const QString absFile = outDir.absoluteFilePath(file);
            if (absFile == file) {
                // already absolute; don't do any checks.
            } else if (exists(absFile)) {
                file = absFile;
            } else {
                const QString localFile = resolveDependency(outDir, file);
                if (localFile.isEmpty()) {
                    if (exists(file)) {
                        warn_msg(WarnDeprecated, ".depend_command for extra compiler %s"
                                 " prints paths relative to source directory",
                                 extraCompiler.toLatin1().constData());
                    } else if (existingDepsOnly) {
                        file.clear();
                    } else {
                        file = absFile;  // fallback for generated resources
                    }
                } else {
                    file = localFile;
                }
            }
            if (!file.isEmpty())
                file = fileFixify(file);
        }
        deps->append(dep_cmd_deps);
    }
}